

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O0

void toml::detail::skip_array_like<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  char_type_conflict cVar2;
  context<toml::type_config> *ctx_00;
  size_t sVar3;
  location *in_RSI;
  location *in_RDI;
  context<toml::type_config> *in_stack_000000b8;
  location *in_stack_000000c0;
  location checkpoint;
  spec *spec;
  location *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  byte in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined4 in_stack_fffffffffffffe78;
  int iVar4;
  undefined2 in_stack_fffffffffffffe7c;
  byte in_stack_fffffffffffffe7e;
  byte in_stack_fffffffffffffe7f;
  location *in_stack_fffffffffffffe80;
  location *in_stack_fffffffffffffe88;
  location *in_stack_fffffffffffffe90;
  context<toml::type_config> *in_stack_ffffffffffffff08;
  location *in_stack_ffffffffffffff10;
  spec *in_stack_ffffffffffffff18;
  location *in_stack_ffffffffffffff60;
  sequence *in_stack_ffffffffffffff68;
  
  ctx_00 = (context<toml::type_config> *)
           context<toml::type_config>::toml_spec((context<toml::type_config> *)in_RSI);
  location::advance(in_stack_fffffffffffffe80,
                    CONCAT17(in_stack_fffffffffffffe7f,
                             CONCAT16(in_stack_fffffffffffffe7e,
                                      CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
                            ));
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            bVar1 = location::eof((location *)
                                  CONCAT17(in_stack_fffffffffffffe77,
                                           CONCAT16(in_stack_fffffffffffffe76,
                                                    in_stack_fffffffffffffe70)));
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return;
            }
            cVar2 = location::current(in_stack_fffffffffffffe68);
            if ((cVar2 != '\"') &&
               (cVar2 = location::current(in_stack_fffffffffffffe68), cVar2 != '\'')) break;
            skip_string_like<toml::type_config>(in_stack_000000c0,in_stack_000000b8);
          }
          cVar2 = location::current(in_stack_fffffffffffffe68);
          if (cVar2 != '#') break;
          skip_comment_block<toml::type_config>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08)
          ;
        }
        cVar2 = location::current(in_stack_fffffffffffffe68);
        if (cVar2 != '{') break;
        skip_inline_table_like<toml::type_config>(in_RSI,ctx_00);
      }
      cVar2 = location::current(in_stack_fffffffffffffe68);
      if (cVar2 != '[') break;
      location::location(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe7f = 0;
      in_stack_fffffffffffffe7e = 0;
      syntax::std_table(&in_stack_ffffffffffffff08->toml_spec_);
      sequence::scan(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      bVar1 = region::is_ok((region *)0x7030e3);
      in_stack_fffffffffffffe76 = true;
      if (!bVar1) {
        syntax::array_table(in_stack_ffffffffffffff18);
        in_stack_fffffffffffffe7f = 1;
        sequence::scan(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        in_stack_fffffffffffffe7e = 1;
        in_stack_fffffffffffffe76 = region::is_ok((region *)0x703131);
      }
      in_stack_fffffffffffffe77 = in_stack_fffffffffffffe76;
      if ((in_stack_fffffffffffffe7e & 1) != 0) {
        region::~region((region *)
                        CONCAT17(in_stack_fffffffffffffe76,
                                 CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      }
      if ((in_stack_fffffffffffffe7f & 1) != 0) {
        sequence::~sequence((sequence *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)))
        ;
      }
      region::~region((region *)
                      CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      sequence::~sequence((sequence *)
                          CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      if ((in_stack_fffffffffffffe76 & 1) == 0) {
        skip_array_like<toml::type_config>(in_RSI,ctx_00);
        iVar4 = 0;
      }
      else {
        location::operator=((location *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                            in_stack_fffffffffffffe68);
        iVar4 = 3;
      }
      location::~location((location *)
                          CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
      if (iVar4 != 0) {
        return;
      }
      in_stack_fffffffffffffe78 = 0;
    }
    cVar2 = location::current(in_stack_fffffffffffffe68);
    if (cVar2 == '=') {
      do {
        sVar3 = location::get_location(in_RDI);
        if (sVar3 == 0) {
          return;
        }
        location::retrace((location *)
                          CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
        cVar2 = location::current(in_stack_fffffffffffffe68);
      } while (cVar2 != '\n');
      location::advance(in_stack_fffffffffffffe80,
                        CONCAT17(in_stack_fffffffffffffe7f,
                                 CONCAT16(in_stack_fffffffffffffe7e,
                                          CONCAT24(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78))));
      return;
    }
    cVar2 = location::current(in_stack_fffffffffffffe68);
    if (cVar2 == ']') break;
    location::advance(in_stack_fffffffffffffe80,
                      CONCAT17(in_stack_fffffffffffffe7f,
                               CONCAT16(in_stack_fffffffffffffe7e,
                                        CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ))));
  }
  return;
}

Assistant:

void skip_array_like(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    assert(loc.current() == '[');
    loc.advance();

    while( ! loc.eof())
    {
        if(loc.current() == '\"' || loc.current() == '\'')
        {
            skip_string_like(loc, ctx);
        }
        else if(loc.current() == '#')
        {
            skip_comment_block(loc, ctx);
        }
        else if(loc.current() == '{')
        {
            skip_inline_table_like(loc, ctx);
        }
        else if(loc.current() == '[')
        {
            const auto checkpoint = loc;
            if(syntax::std_table(spec).scan(loc).is_ok() ||
               syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = checkpoint;
                break;
            }
            // if it is not a table-definition, then it is an array.
            skip_array_like(loc, ctx);
        }
        else if(loc.current() == '=')
        {
            // key-value pair cannot be inside the array.
            // guessing the error is "missing closing bracket `]`".
            // find the previous key just before `=`.
            while(loc.get_location() != 0)
            {
                loc.retrace();
                if(loc.current() == '\n')
                {
                    loc.advance();
                    break;
                }
            }
            break;
        }
        else if(loc.current() == ']')
        {
            break; // found closing bracket
        }
        else
        {
            loc.advance();
        }
    }
    return ;
}